

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

void reset_file_context(rar5 *rar)

{
  rar5 *rar_local;
  
  memset(&rar->file,0,0x770);
  blake2sp_init(&(rar->file).b2state,0x20);
  if (((ulong)rar->main & 1) == 0) {
    (rar->cstate).solid_offset = 0;
  }
  else {
    (rar->cstate).solid_offset = (rar->cstate).write_ptr + (rar->cstate).solid_offset;
  }
  (rar->cstate).write_ptr = 0;
  (rar->cstate).last_write_ptr = 0;
  (rar->cstate).last_unstore_ptr = 0;
  (rar->file).redir_type = 0;
  (rar->file).redir_flags = 0;
  free_filters(rar);
  return;
}

Assistant:

static void reset_file_context(struct rar5* rar) {
	memset(&rar->file, 0, sizeof(rar->file));
	blake2sp_init(&rar->file.b2state, 32);

	if(rar->main.solid) {
		rar->cstate.solid_offset += rar->cstate.write_ptr;
	} else {
		rar->cstate.solid_offset = 0;
	}

	rar->cstate.write_ptr = 0;
	rar->cstate.last_write_ptr = 0;
	rar->cstate.last_unstore_ptr = 0;

	rar->file.redir_type = REDIR_TYPE_NONE;
	rar->file.redir_flags = 0;

	free_filters(rar);
}